

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.cpp
# Opt level: O2

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::ProcessR::operator()
          (ProcessR *this,iterator_t *str,iterator_t end)

{
  double dVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  POMDPDiscrete *pPVar5;
  pointer puVar6;
  pointer puVar7;
  ulong uVar8;
  ulong uVar9;
  ParserPOMDPFormat_Spirit *pPVar10;
  ostream *poVar11;
  E *pEVar12;
  uint *puVar13;
  pointer puVar14;
  pointer puVar15;
  pointer puVar16;
  uint uVar17;
  uint uVar18;
  uint *puVar19;
  pointer puVar20;
  stringstream ss;
  ostream local_1a8 [376];
  
  pPVar10 = this->_m_po;
  if (pPVar10->_m_lp_type != DOUBLE) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar11 = std::operator<<(local_1a8,"ProcessR:last parsed type should be a double. (at ");
    poVar11 = POMDPFormatParsing::operator<<(poVar11,&str->_pos);
    poVar11 = std::operator<<(poVar11,")");
    std::endl<char,std::char_traits<char>>(poVar11);
    pEVar12 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar12,&ss);
    __cxa_throw(pEVar12,&E::typeinfo,E::~E);
  }
  if ((long)(pPVar10->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pPVar10->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start == 4) {
    if ((long)(pPVar10->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(pPVar10->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start == 4) {
      dVar1 = pPVar10->_m_lp_double;
      uVar8 = (**(code **)(*(long *)&(pPVar10->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                     super_MultiAgentDecisionProcessDiscrete.
                                     super_MultiAgentDecisionProcess + 0x30))();
      pPVar10 = this->_m_po;
      puVar13 = (pPVar10->_m_lp_toSI).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar2 = *(pPVar10->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar17 = *puVar13;
      uVar18 = pPVar10->_m_anyStateIndex;
      if (uVar2 == pPVar10->_m_anyJOIndex && uVar17 == uVar18) {
        puVar14 = (pPVar10->_m_lp_fromSI).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (*puVar14 == uVar17) {
          if ((pPVar10->_m_lp_fromSI).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish != puVar14) {
            (pPVar10->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar14;
          }
          for (_ss = 0; _ss < uVar8; _ss = _ss + 1) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&this->_m_po->_m_lp_fromSI,(value_type_conflict1 *)&ss);
          }
          pPVar10 = this->_m_po;
          puVar14 = (pPVar10->_m_lp_fromSI).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        puVar3 = (pPVar10->_m_lp_fromSI).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (; puVar14 != puVar3; puVar14 = puVar14 + 1) {
          uVar2 = *puVar14;
          puVar4 = (this->_m_po->_m_lp_JAI).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (puVar15 = (this->_m_po->_m_lp_JAI).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start; puVar15 != puVar4; puVar15 = puVar15 + 1)
          {
            pPVar5 = this->_m_po->_m_decPOMDPDiscrete;
            (**(code **)(*(long *)&(pPVar5->super_DecPOMDPDiscrete).
                                   super_MultiAgentDecisionProcessDiscrete.
                                   super_MultiAgentDecisionProcess + 0x180))
                      (dVar1,pPVar5,uVar2,*puVar15);
          }
        }
      }
      else {
        puVar19 = (pPVar10->_m_lp_fromSI).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (uVar2 == pPVar10->_m_anyJOIndex) {
          if (*puVar19 == uVar18) {
            if ((pPVar10->_m_lp_fromSI).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish != puVar19) {
              (pPVar10->_m_lp_fromSI).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar19;
            }
            uVar8 = 0;
            while( true ) {
              _ss = (uint)uVar8;
              uVar9 = (**(code **)(*(long *)&(pPVar10->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                             super_MultiAgentDecisionProcessDiscrete.
                                             super_MultiAgentDecisionProcess + 0x30))();
              if (uVar9 <= uVar8) break;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&this->_m_po->_m_lp_fromSI,(value_type_conflict1 *)&ss);
              pPVar10 = this->_m_po;
              uVar8 = (ulong)(_ss + 1);
            }
            pPVar10 = this->_m_po;
            puVar19 = (pPVar10->_m_lp_fromSI).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          puVar13 = (pPVar10->_m_lp_fromSI).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          for (; puVar19 != puVar13; puVar19 = puVar19 + 1) {
            uVar2 = *puVar19;
            puVar3 = (this->_m_po->_m_lp_JAI).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (puVar14 = (this->_m_po->_m_lp_JAI).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start; puVar14 != puVar3;
                puVar14 = puVar14 + 1) {
              uVar17 = *puVar14;
              puVar4 = (this->_m_po->_m_lp_toSI).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              for (puVar15 = (this->_m_po->_m_lp_toSI).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start; puVar15 != puVar4;
                  puVar15 = puVar15 + 1) {
                pPVar5 = this->_m_po->_m_decPOMDPDiscrete;
                (**(code **)(*(long *)&(pPVar5->super_DecPOMDPDiscrete).
                                       super_MultiAgentDecisionProcessDiscrete.
                                       super_MultiAgentDecisionProcess + 0x188))
                          (dVar1,pPVar5,uVar2,uVar17,*puVar15);
              }
            }
          }
        }
        else {
          if (*puVar19 == uVar18) {
            if ((pPVar10->_m_lp_fromSI).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish != puVar19) {
              (pPVar10->_m_lp_fromSI).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar19;
            }
            uVar8 = 0;
            while( true ) {
              _ss = (uint)uVar8;
              uVar9 = (**(code **)(*(long *)&(pPVar10->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                             super_MultiAgentDecisionProcessDiscrete.
                                             super_MultiAgentDecisionProcess + 0x30))();
              if (uVar9 <= uVar8) break;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&this->_m_po->_m_lp_fromSI,(value_type_conflict1 *)&ss);
              pPVar10 = this->_m_po;
              uVar8 = (ulong)(_ss + 1);
            }
            pPVar10 = this->_m_po;
            puVar13 = (pPVar10->_m_lp_toSI).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar18 = pPVar10->_m_anyStateIndex;
            uVar17 = *puVar13;
          }
          if (uVar17 == uVar18) {
            if ((pPVar10->_m_lp_toSI).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish != puVar13) {
              (pPVar10->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = puVar13;
            }
            uVar8 = 0;
            while( true ) {
              _ss = (uint)uVar8;
              uVar9 = (**(code **)(*(long *)&(pPVar10->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                             super_MultiAgentDecisionProcessDiscrete.
                                             super_MultiAgentDecisionProcess + 0x30))();
              if (uVar9 <= uVar8) break;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&this->_m_po->_m_lp_toSI,(value_type_conflict1 *)&ss);
              pPVar10 = this->_m_po;
              uVar8 = (ulong)(_ss + 1);
            }
            pPVar10 = this->_m_po;
          }
          puVar3 = (pPVar10->_m_lp_JOI).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (puVar14 = (pPVar10->_m_lp_JOI).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start; puVar14 != puVar3; puVar14 = puVar14 + 1)
          {
            uVar2 = *puVar14;
            puVar4 = (this->_m_po->_m_lp_fromSI).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (puVar15 = (this->_m_po->_m_lp_fromSI).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start; puVar15 != puVar4;
                puVar15 = puVar15 + 1) {
              uVar17 = *puVar15;
              puVar6 = (this->_m_po->_m_lp_JAI).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              for (puVar16 = (this->_m_po->_m_lp_JAI).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start; puVar16 != puVar6;
                  puVar16 = puVar16 + 1) {
                uVar18 = *puVar16;
                puVar7 = (this->_m_po->_m_lp_toSI).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                for (puVar20 = (this->_m_po->_m_lp_toSI).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start; puVar20 != puVar7;
                    puVar20 = puVar20 + 1) {
                  pPVar5 = this->_m_po->_m_decPOMDPDiscrete;
                  (**(code **)(*(long *)&(pPVar5->super_DecPOMDPDiscrete).
                                         super_MultiAgentDecisionProcessDiscrete.
                                         super_MultiAgentDecisionProcess + 400))
                            (dVar1,pPVar5,uVar17,uVar18,*puVar20,uVar2);
                }
              }
            }
          }
        }
      }
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar11 = std::operator<<(local_1a8,"ProcessR: _m_lp_toSI has size != 1. (at ");
    poVar11 = POMDPFormatParsing::operator<<(poVar11,&str->_pos);
    poVar11 = std::operator<<(poVar11,")");
    std::endl<char,std::char_traits<char>>(poVar11);
    pEVar12 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar12,&ss);
    __cxa_throw(pEVar12,&E::typeinfo,E::~E);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar11 = std::operator<<(local_1a8,"ProcessR: _m_lp_fromSI has size != 1. (at ");
  poVar11 = POMDPFormatParsing::operator<<(poVar11,&str->_pos);
  poVar11 = std::operator<<(poVar11,")");
  std::endl<char,std::char_traits<char>>(poVar11);
  pEVar12 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar12,&ss);
  __cxa_throw(pEVar12,&E::typeinfo,E::~E);
}

Assistant:

void ParserPOMDPFormat_Spirit::ProcessR::operator()(iterator_t str, iterator_t end) const
{
    if(_m_po->_m_lp_type != DOUBLE)
    {
        stringstream ss; ss<<"ProcessR:last parsed type should be a double. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    double reward = _m_po->_m_lp_double;
    if(        _m_po-> _m_lp_fromSI.size() != 1 )
    {
        stringstream ss; ss<<"ProcessR: _m_lp_fromSI has size != 1. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }   
    if(        _m_po-> _m_lp_toSI.size() != 1 )
    {
        stringstream ss; ss<<"ProcessR: _m_lp_toSI has size != 1. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }    
    size_t nrS =  _m_po->GetPOMDPDiscrete()->GetNrStates();
    //size_t nrJO = _m_po->GetPOMDPDiscrete()->GetNrJointObservations();
    Index sucSI = _m_po-> _m_lp_toSI[0];
    Index joI = _m_po->_m_lp_JOI[0];
    if( sucSI == _m_po->_m_anyStateIndex && joI == _m_po->_m_anyJOIndex) 
    {
        // rewards of the form R: ja : s : * : * : %f, so we can simply do
        // AddReward()
    
        if(_m_po->_m_lp_fromSI[0] == _m_po->_m_anyStateIndex)
        {
            _m_po->_m_lp_fromSI.clear();
            for(Index si=0; si < nrS; si++)
                _m_po->_m_lp_fromSI.push_back(si);
        }            
        
        vector<Index>::iterator sI_it = _m_po->_m_lp_fromSI.begin();
        vector<Index>::iterator sI_last = _m_po->_m_lp_fromSI.end();
        while(sI_it != sI_last)
        {
            Index sI = *sI_it;
            vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
            vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
            while(jaI_it != jaI_last)
            {
                Index jaI = *jaI_it;
                _m_po->GetPOMDPDiscrete()->SetReward(sI, jaI, reward);
                if(DEBUG_POMDP_PARSE)
                    cout << "Setting R("<<sI<<","<<jaI<<") = "<<reward<<endl;
                jaI_it++;
            }
            sI_it++;
        }
    }    
    else if( joI == _m_po->_m_anyJOIndex ) //but end-state is not ANY_INDEX
    {
        if( _m_po->_m_lp_fromSI[0] == _m_po->_m_anyStateIndex )
        {
            _m_po->_m_lp_fromSI.clear();
            for(Index si=0; si < _m_po->GetPOMDPDiscrete()->GetNrStates();si++)
                _m_po->_m_lp_fromSI.push_back(si);
        }
/*        Obsolete test...
        if( sucSI == ANY_INDEX )
        {
            _m_po->_m_lp_toSI.clear();
            for(Index si=0; si < _m_po->GetPOMDPDiscrete()->GetNrStates();si++)
                _m_po->_m_lp_toSI.push_back(si);
        }*/
        vector<Index>::iterator sI_it = _m_po->_m_lp_fromSI.begin();
        vector<Index>::iterator sI_last = _m_po->_m_lp_fromSI.end();
        while(sI_it != sI_last)
        {
            Index sI = *sI_it;
            vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
            vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
            while(jaI_it != jaI_last)
            {
                Index jaI = *jaI_it;
                vector<Index>::iterator sucSI_it = _m_po->_m_lp_toSI.begin();
                vector<Index>::iterator sucSI_last = _m_po->_m_lp_toSI.end();
                while(sucSI_it != sucSI_last)
                {
                    sucSI = *sucSI_it; 
                    _m_po->GetPOMDPDiscrete()->SetReward(sI, jaI, sucSI, reward);
                    if(DEBUG_POMDP_PARSE)
                        cout << "Setting R("<<sI<<","<<jaI<<","<<sucSI<<") = "<<
                            reward<<endl;
                    sucSI_it++;
                }
                jaI_it++;
            }
            sI_it++;
        }

    }
    else // both end-state and joI are specified. joI != ANY_INDEX
         // (otherwise it would fall under previous else if )
    {

        if( _m_po->_m_lp_fromSI[0] == _m_po->_m_anyStateIndex )
        {
            _m_po->_m_lp_fromSI.clear();
            for(Index si=0; si < _m_po->GetPOMDPDiscrete()->GetNrStates();si++)
                _m_po->_m_lp_fromSI.push_back(si);
        }
        if( _m_po->_m_lp_toSI[0] == _m_po->_m_anyStateIndex )
        {
            _m_po->_m_lp_toSI.clear();
            for(Index si=0; si < _m_po->GetPOMDPDiscrete()->GetNrStates();si++)
                _m_po->_m_lp_toSI.push_back(si);
        }
        vector<Index>::iterator joI_it = _m_po->_m_lp_JOI.begin();
        vector<Index>::iterator joI_last = _m_po->_m_lp_JOI.end();
        while(joI_it != joI_last)
        {
            joI = *joI_it;
            vector<Index>::iterator sI_it = _m_po->_m_lp_fromSI.begin();
            vector<Index>::iterator sI_last = _m_po->_m_lp_fromSI.end();
            while(sI_it != sI_last)
            {
                Index sI = *sI_it;
                vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
                vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
                while(jaI_it != jaI_last)
                {
                    Index jaI = *jaI_it;
                    vector<Index>::iterator sucSI_it = _m_po->_m_lp_toSI.begin();
                    vector<Index>::iterator sucSI_last = _m_po->_m_lp_toSI.end();
                    while(sucSI_it != sucSI_last)
                    {
                        sucSI = *sucSI_it; 
                        _m_po->GetPOMDPDiscrete()->SetReward(sI, jaI, sucSI,joI, 
                            reward);
                        if(DEBUG_POMDP_PARSE)
                            cout << "Setting R("<<sI<<","<<jaI<<","<<sucSI<<
                                ","<<joI<<") = "<<reward<<endl;
                        sucSI_it++;
                    }
                    jaI_it++;
                }
                sI_it++;
            }
            joI_it++;
        }
    } //end else (both end-state and joI are specified)
}